

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O3

vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct>::
ConvertToStruct(vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct> *this)

{
  pointer pOVar1;
  pointer this_00;
  OutPointStruct data;
  OutPointStruct local_88;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_JsonVector<cfd::js::api::json::OutPoint>).
            super_vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
            .
            super__Vector_base<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this->super_JsonVector<cfd::js::api::json::OutPoint>).
           super_vector<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
           .
           super__Vector_base<cfd::js::api::json::OutPoint,_std::allocator<cfd::js::api::json::OutPoint>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pOVar1) {
    do {
      js::api::json::OutPoint::ConvertToStruct(&local_88,this_00);
      std::vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>::
      push_back(__return_storage_ptr__,&local_88);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_88.ignore_items._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.txid._M_dataplus._M_p != &local_88.txid.field_2) {
        operator_delete(local_88.txid._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pOVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }